

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

void evmap_delete_all_(event_base *base)

{
  undefined8 *puVar1;
  event *peVar2;
  long lVar3;
  
  if (0 < (base->sigmap).nentries) {
    lVar3 = 0;
    do {
      puVar1 = (undefined8 *)(base->sigmap).entries[lVar3];
      if (puVar1 != (undefined8 *)0x0) {
        while (peVar2 = (event *)*puVar1, peVar2 != (event *)0x0) {
          event_del(peVar2);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (base->sigmap).nentries);
  }
  if (0 < (base->io).nentries) {
    lVar3 = 0;
    do {
      puVar1 = (undefined8 *)(base->io).entries[lVar3];
      if (puVar1 != (undefined8 *)0x0) {
        while (peVar2 = (event *)*puVar1, peVar2 != (event *)0x0) {
          event_del(peVar2);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (base->io).nentries);
  }
  return;
}

Assistant:

void
evmap_delete_all_(struct event_base *base)
{
	evmap_signal_foreach_signal(base, evmap_signal_delete_all_iter_fn, NULL);
	evmap_io_foreach_fd(base, evmap_io_delete_all_iter_fn, NULL);
}